

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

QSize __thiscall QMdiSubWindow::minimumSizeHint(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  QLayout *pQVar7;
  ulong uVar8;
  QStyle *pQVar9;
  QProxyStyle *this_01;
  long lVar10;
  uint uVar11;
  QSize QVar12;
  uint uVar13;
  long in_FS_OFFSET;
  int minWidth;
  int margin;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    QWidget::ensurePolished(&this->super_QWidget);
  }
  if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
    bVar3 = QWidget::isMinimized(&this->super_QWidget);
    if ((bVar3) && (*(char *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2d4) == '\0')) {
      QVar12 = QMdiSubWindowPrivate::iconSize(this_00);
      uVar8 = (ulong)QVar12 >> 0x20;
      goto LAB_0045ac07;
    }
  }
  local_3c = -0x55555556;
  local_40 = 0xaaaaaaaa;
  QMdiSubWindowPrivate::sizeParameters(this_00,&local_3c,(int *)&local_40);
  iVar6 = local_3c;
  iVar4 = QMdiSubWindowPrivate::titleBarHeight(this_00);
  lVar10 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(long *)(lVar10 + 0x10) != 0) && (*(char *)(lVar10 + 0x2d4) == '\x01')) {
    pQVar1 = (this->super_QWidget).data;
    uVar11 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    if ((int)uVar11 < (int)local_40) {
      uVar11 = local_40;
    }
    QVar12.ht.m_i = 0;
    QVar12.wd.m_i = uVar11;
    uVar11 = QMdiSubWindowPrivate::titleBarHeight(this_00);
    uVar8 = (ulong)uVar11;
    goto LAB_0045ac07;
  }
  uVar13 = iVar4 + iVar6;
  pQVar7 = QWidget::layout(&this->super_QWidget);
  uVar11 = uVar13;
  if (pQVar7 == (QLayout *)0x0) {
    pDVar2 = (this_00->baseWidget).wp.d;
    if ((((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
        ((this_00->baseWidget).wp.value != (QObject *)0x0)) &&
       ((*(byte *)(*(long *)((this_00->baseWidget).wp.value + 0x20) + 9) & 0x80) != 0)) {
      uVar8 = (**(code **)(*(long *)(this_00->baseWidget).wp.value + 0x78))();
      goto LAB_0045aa90;
    }
  }
  else {
    pQVar7 = QWidget::layout(&this->super_QWidget);
    uVar8 = (**(code **)(*(long *)pQVar7 + 0x90))(pQVar7);
LAB_0045aa90:
    if ((uVar8 & 0x8000000080000000) == 0) {
      uVar5 = (int)uVar8 + iVar6 * 2;
      if ((int)uVar5 < (int)local_40) {
        uVar5 = local_40;
      }
      uVar11 = (int)(uVar8 >> 0x20) + uVar13;
      local_40 = uVar5;
    }
  }
  pDVar2 = (this_00->sizeGrip).wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     ((this_00->sizeGrip).wp.value == (QObject *)0x0)) {
LAB_0045ab58:
    iVar6 = 0;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      pQVar9 = QWidget::style(&this->super_QWidget);
      this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
      if (this_01 != (QProxyStyle *)0x0) {
        pQVar9 = QProxyStyle::baseStyle(this_01);
      }
      lVar10 = (**(code **)(*(long *)pQVar9 + 8))(pQVar9,"QMacStyle");
      iVar6 = 0;
      if ((lVar10 != 0) &&
         (((pDVar2 = (this_00->sizeGrip).wp.d, pDVar2 == (Data *)0x0 || (*(int *)(pDVar2 + 4) == 0))
          || ((this_00->sizeGrip).wp.value == (QObject *)0x0)))) {
        pQVar9 = QWidget::style(&this->super_QWidget);
        iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x45,0,this);
      }
    }
  }
  else {
    bVar3 = QWidget::isVisibleTo((QWidget *)(this_00->sizeGrip).wp.value,&this->super_QWidget);
    if (!bVar3) goto LAB_0045ab58;
    lVar10 = *(long *)((this_00->sizeGrip).wp.value + 0x20);
    iVar6 = (*(int *)(lVar10 + 0x20) - *(int *)(lVar10 + 0x18)) + 1;
  }
  uVar5 = iVar6 + uVar13;
  if ((int)(iVar6 + uVar13) < (int)uVar11) {
    uVar5 = uVar11;
  }
  uVar8 = (ulong)uVar5;
  QVar12.ht.m_i = 0;
  QVar12.wd.m_i = local_40;
LAB_0045ac07:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar12 & 0xffffffff | uVar8 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QMdiSubWindow::minimumSizeHint() const
{
    Q_D(const QMdiSubWindow);
    if (isVisible())
        ensurePolished();

    // Minimized window.
    if (parent() && isMinimized() && !isShaded())
        return d->iconSize();

    // Calculate window decoration.
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    int decorationHeight = margin + d->titleBarHeight();
    int minHeight = decorationHeight;

    // Shaded window.
    if (parent() && isShaded())
        return QSize(qMax(minWidth, width()), d->titleBarHeight());

    // Content
    if (layout()) {
        QSize minLayoutSize = layout()->minimumSize();
        if (minLayoutSize.isValid()) {
            minWidth = qMax(minWidth, minLayoutSize.width() + 2 * margin);
            minHeight += minLayoutSize.height();
        }
    } else if (d->baseWidget && d->baseWidget->isVisible()) {
        QSize minBaseWidgetSize = d->baseWidget->minimumSizeHint();
        if (minBaseWidgetSize.isValid()) {
            minWidth = qMax(minWidth, minBaseWidgetSize.width() + 2 * margin);
            minHeight += minBaseWidgetSize.height();
        }
    }

#if QT_CONFIG(sizegrip)
    // SizeGrip
    int sizeGripHeight = 0;
    if (d->sizeGrip && d->sizeGrip->isVisibleTo(const_cast<QMdiSubWindow *>(this)))
        sizeGripHeight = d->sizeGrip->height();
    else if (parent() && isMacStyle(style()) && !d->sizeGrip)
        sizeGripHeight = style()->pixelMetric(QStyle::PM_SizeGripSize, nullptr, this);
    minHeight = qMax(minHeight, decorationHeight + sizeGripHeight);
#endif

    return QSize(minWidth, minHeight);
}